

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Stream.cc
# Opt level: O0

bool __thiscall
QPDFObjectHandle::pipeStreamData
          (QPDFObjectHandle *this,Pipeline *p,bool *filtering_attempted,int encode_flags,
          qpdf_stream_decode_level_e decode_level,bool suppress_warnings,bool will_retry)

{
  bool bVar1;
  QPDFObjectHandle local_40;
  byte local_2a;
  byte local_29;
  qpdf_stream_decode_level_e local_28;
  bool will_retry_local;
  int iStack_24;
  bool suppress_warnings_local;
  qpdf_stream_decode_level_e decode_level_local;
  int encode_flags_local;
  bool *filtering_attempted_local;
  Pipeline *p_local;
  QPDFObjectHandle *this_local;
  
  local_2a = will_retry;
  local_29 = suppress_warnings;
  local_28 = decode_level;
  iStack_24 = encode_flags;
  _decode_level_local = filtering_attempted;
  filtering_attempted_local = (bool *)p;
  p_local = (Pipeline *)this;
  as_stream(&local_40,(typed)this);
  bVar1 = ::qpdf::Stream::pipeStreamData
                    ((Stream *)&local_40,(Pipeline *)filtering_attempted_local,_decode_level_local,
                     iStack_24,local_28,(bool)(local_29 & 1),(bool)(local_2a & 1));
  ::qpdf::Stream::~Stream((Stream *)&local_40);
  return bVar1;
}

Assistant:

bool
QPDFObjectHandle::pipeStreamData(
    Pipeline* p,
    bool* filtering_attempted,
    int encode_flags,
    qpdf_stream_decode_level_e decode_level,
    bool suppress_warnings,
    bool will_retry)
{
    return as_stream(error).pipeStreamData(
        p, filtering_attempted, encode_flags, decode_level, suppress_warnings, will_retry);
}